

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong mkvparser::GetUIntLength(IMkvReader *pReader,longlong pos,long *len)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  longlong lStack_40;
  uchar b;
  longlong available;
  longlong total;
  
  if (-1 < pos && pReader != (IMkvReader *)0x0) {
    iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&total,&available);
    lStack_40 = -2;
    if (((-1 < iVar1) && (total < 0 || available <= total)) &&
       (*len = 1, lStack_40 = pos, pos < available)) {
      iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,1,&b);
      if (iVar1 == 0) {
        if (b == '\0') {
          lStack_40 = -2;
        }
        else {
          lVar2 = *len;
          lStack_40 = 0;
          for (uVar3 = 0x80; lVar2 = lVar2 + 1, (uVar3 & b) == 0; uVar3 = uVar3 >> 1) {
            *len = lVar2;
          }
        }
      }
      else {
        lStack_40 = (longlong)iVar1;
      }
    }
    return lStack_40;
  }
  return -2;
}

Assistant:

long long GetUIntLength(IMkvReader* pReader, long long pos, long& len) {
  if (!pReader || pos < 0)
    return E_FILE_FORMAT_INVALID;

  long long total, available;

  int status = pReader->Length(&total, &available);
  if (status < 0 || (total >= 0 && available > total))
    return E_FILE_FORMAT_INVALID;

  len = 1;

  if (pos >= available)
    return pos;  // too few bytes available

  unsigned char b;

  status = pReader->Read(pos, 1, &b);

  if (status != 0)
    return status;

  if (b == 0)  // we can't handle u-int values larger than 8 bytes
    return E_FILE_FORMAT_INVALID;

  unsigned char m = 0x80;

  while (!(b & m)) {
    m >>= 1;
    ++len;
  }

  return 0;  // success
}